

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int in_ECX;
  undefined8 *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar9 [64];
  __m128 _outp_5;
  __m128 _b_5;
  __m128 _p_5;
  __m256 _outp_4;
  __m256 _b_4;
  __m128 _b1_2;
  __m128 _b0_2;
  __m256 _p_4;
  __m512 _outp_3;
  __m512 _b_3;
  __m256 _b23;
  __m256 _b01;
  __m128 _b3;
  __m128 _b2;
  __m128 _b1_1;
  __m128 _b0_1;
  __m512 _p_3;
  int i_2;
  __m256 _outp_2;
  __m256 _b_2;
  __m256 _p_2;
  __m512 _outp_1;
  __m512 _b_1;
  __m256 _b1;
  __m256 _b0;
  __m512 _p_1;
  int i_1;
  __m512 _outp;
  __m512 _b;
  __m512 _p;
  int i;
  binary_op_mul op;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 uStack_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  int local_a24;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 uStack_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  int local_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 uStack_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  int local_7c0;
  undefined8 *local_7b0;
  float *local_7a8;
  undefined1 (*local_7a0) [64];
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 uStack_390;
  undefined8 uStack_388;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined4 uStack_84;
  float local_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  
  local_7b0 = in_RDX;
  local_7a8 = in_RSI;
  local_7a0 = in_RDI;
  if (in_R8D == 0x10) {
    for (local_7c0 = 0; local_7c0 < in_ECX; local_7c0 = local_7c0 + 1) {
      auVar9 = vbroadcastss_avx512f(ZEXT416((uint)*local_7a8));
      auVar9 = vmulps_avx512f(*local_7a0,auVar9);
      local_880 = auVar9._0_8_;
      uStack_878 = auVar9._8_8_;
      uStack_870 = auVar9._16_8_;
      uStack_868 = auVar9._24_8_;
      uStack_860 = auVar9._32_8_;
      uStack_858 = auVar9._40_8_;
      uStack_850 = auVar9._48_8_;
      uStack_848 = auVar9._56_8_;
      *local_7b0 = local_880;
      local_7b0[1] = uStack_878;
      local_7b0[2] = uStack_870;
      local_7b0[3] = uStack_868;
      local_7b0[4] = uStack_860;
      local_7b0[5] = uStack_858;
      local_7b0[6] = uStack_850;
      local_7b0[7] = uStack_848;
      local_7a0 = local_7a0 + 1;
      local_7a8 = local_7a8 + 1;
      local_7b0 = local_7b0 + 8;
    }
  }
  if (in_R8D == 8) {
    for (local_884 = 0; local_884 + 1 < in_ECX; local_884 = local_884 + 2) {
      fVar1 = *local_7a8;
      auVar4 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x30);
      uStack_3d0 = auVar5._0_8_;
      uStack_3c8 = auVar5._8_8_;
      fVar1 = local_7a8[1];
      auVar5 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x30);
      auVar6 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar1),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar1),0x30);
      uStack_390 = auVar6._0_8_;
      uStack_388 = auVar6._8_8_;
      auVar8._16_8_ = uStack_390;
      auVar8._0_16_ = auVar5;
      auVar8._24_8_ = uStack_388;
      auVar9 = vinsertf64x4_avx512f
                         (ZEXT3264(CONCAT824(uStack_3c8,CONCAT816(uStack_3d0,auVar4))),auVar8,1);
      auVar9 = vmulps_avx512f(*local_7a0,auVar9);
      local_9c0 = auVar9._0_8_;
      uStack_9b8 = auVar9._8_8_;
      uStack_9b0 = auVar9._16_8_;
      uStack_9a8 = auVar9._24_8_;
      uStack_9a0 = auVar9._32_8_;
      uStack_998 = auVar9._40_8_;
      uStack_990 = auVar9._48_8_;
      uStack_988 = auVar9._56_8_;
      *local_7b0 = local_9c0;
      local_7b0[1] = uStack_9b8;
      local_7b0[2] = uStack_9b0;
      local_7b0[3] = uStack_9a8;
      local_7b0[4] = uStack_9a0;
      local_7b0[5] = uStack_998;
      local_7b0[6] = uStack_990;
      local_7b0[7] = uStack_988;
      local_7a0 = local_7a0 + 1;
      local_7a8 = local_7a8 + 2;
      local_7b0 = local_7b0 + 8;
    }
    for (; local_884 < in_ECX; local_884 = local_884 + 1) {
      fVar1 = *local_7a8;
      auVar4 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x30);
      local_e0 = (float)*(undefined8 *)*local_7a0;
      fStack_dc = (float)((ulong)*(undefined8 *)*local_7a0 >> 0x20);
      fStack_d8 = (float)*(undefined8 *)(*local_7a0 + 8);
      fStack_d4 = (float)((ulong)*(undefined8 *)(*local_7a0 + 8) >> 0x20);
      fStack_d0 = (float)*(undefined8 *)(*local_7a0 + 0x10);
      fStack_cc = (float)((ulong)*(undefined8 *)(*local_7a0 + 0x10) >> 0x20);
      fStack_c8 = (float)*(undefined8 *)(*local_7a0 + 0x18);
      uStack_c4 = (undefined4)((ulong)*(undefined8 *)(*local_7a0 + 0x18) >> 0x20);
      local_100 = auVar5._0_4_;
      fStack_fc = auVar5._4_4_;
      fStack_f8 = auVar5._8_4_;
      fStack_f4 = auVar5._12_4_;
      fStack_f0 = auVar4._0_4_;
      fStack_ec = auVar4._4_4_;
      fStack_e8 = auVar4._8_4_;
      *local_7b0 = CONCAT44(fStack_dc * fStack_fc,local_e0 * local_100);
      local_7b0[1] = CONCAT44(fStack_d4 * fStack_f4,fStack_d8 * fStack_f8);
      local_7b0[2] = CONCAT44(fStack_cc * fStack_ec,fStack_d0 * fStack_f0);
      local_7b0[3] = CONCAT44(uStack_c4,fStack_c8 * fStack_e8);
      local_7a0 = (undefined1 (*) [64])(*local_7a0 + 0x20);
      local_7a8 = local_7a8 + 1;
      local_7b0 = local_7b0 + 4;
    }
  }
  if (in_R8D == 4) {
    for (local_a24 = 0; local_a24 + 3 < in_ECX; local_a24 = local_a24 + 4) {
      fVar1 = *local_7a8;
      fVar2 = local_7a8[1];
      fVar3 = local_7a8[2];
      auVar7._4_4_ = fVar3;
      auVar7._0_4_ = fVar3;
      auVar7._12_4_ = fVar3;
      auVar7._8_4_ = fVar3;
      fVar3 = local_7a8[3];
      auVar7._20_4_ = fVar3;
      auVar7._16_4_ = fVar3;
      auVar7._28_4_ = fVar3;
      auVar7._24_4_ = fVar3;
      auVar9 = vinsertf64x4_avx512f
                         (ZEXT3264(CONCAT824(CONCAT44(fVar2,fVar2),
                                             CONCAT816(CONCAT44(fVar2,fVar2),
                                                       CONCAT88(CONCAT44(fVar1,fVar1),
                                                                CONCAT44(fVar1,fVar1))))),auVar7,1);
      auVar9 = vmulps_avx512f(*local_7a0,auVar9);
      local_b80 = auVar9._0_8_;
      uStack_b78 = auVar9._8_8_;
      uStack_b70 = auVar9._16_8_;
      uStack_b68 = auVar9._24_8_;
      uStack_b60 = auVar9._32_8_;
      uStack_b58 = auVar9._40_8_;
      uStack_b50 = auVar9._48_8_;
      uStack_b48 = auVar9._56_8_;
      *local_7b0 = local_b80;
      local_7b0[1] = uStack_b78;
      local_7b0[2] = uStack_b70;
      local_7b0[3] = uStack_b68;
      local_7b0[4] = uStack_b60;
      local_7b0[5] = uStack_b58;
      local_7b0[6] = uStack_b50;
      local_7b0[7] = uStack_b48;
      local_7a0 = local_7a0 + 1;
      local_7a8 = local_7a8 + 4;
      local_7b0 = local_7b0 + 8;
    }
    for (; local_a24 + 1 < in_ECX; local_a24 = local_a24 + 2) {
      fVar1 = *local_7a8;
      fVar2 = local_7a8[1];
      local_a0 = (float)*(undefined8 *)*local_7a0;
      fStack_9c = (float)((ulong)*(undefined8 *)*local_7a0 >> 0x20);
      fStack_98 = (float)*(undefined8 *)(*local_7a0 + 8);
      fStack_94 = (float)((ulong)*(undefined8 *)(*local_7a0 + 8) >> 0x20);
      fStack_90 = (float)*(undefined8 *)(*local_7a0 + 0x10);
      fStack_8c = (float)((ulong)*(undefined8 *)(*local_7a0 + 0x10) >> 0x20);
      fStack_88 = (float)*(undefined8 *)(*local_7a0 + 0x18);
      uStack_84 = (undefined4)((ulong)*(undefined8 *)(*local_7a0 + 0x18) >> 0x20);
      *local_7b0 = CONCAT44(fStack_9c * fVar1,local_a0 * fVar1);
      local_7b0[1] = CONCAT44(fStack_94 * fVar1,fStack_98 * fVar1);
      local_7b0[2] = CONCAT44(fStack_8c * fVar2,fStack_90 * fVar2);
      local_7b0[3] = CONCAT44(uStack_84,fStack_88 * fVar2);
      local_7a0 = (undefined1 (*) [64])(*local_7a0 + 0x20);
      local_7a8 = local_7a8 + 2;
      local_7b0 = local_7b0 + 4;
    }
    for (; local_a24 < in_ECX; local_a24 = local_a24 + 1) {
      fVar1 = *local_7a8;
      local_60 = (float)*(undefined8 *)*local_7a0;
      fStack_5c = (float)((ulong)*(undefined8 *)*local_7a0 >> 0x20);
      fStack_58 = (float)*(undefined8 *)(*local_7a0 + 8);
      fStack_54 = (float)((ulong)*(undefined8 *)(*local_7a0 + 8) >> 0x20);
      *local_7b0 = CONCAT44(fStack_5c * fVar1,local_60 * fVar1);
      local_7b0[1] = CONCAT44(fStack_54 * fVar1,fStack_58 * fVar1);
      local_7a0 = (undefined1 (*) [64])(*local_7a0 + 0x10);
      local_7a8 = local_7a8 + 1;
      local_7b0 = local_7b0 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        for (; i < w; i++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
#if __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
#if __AVX__
#if __AVX512F__
        for (; i + 3 < w; i += 4)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}